

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repair_Complete_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Repair_Complete_PDU::Decode
          (Repair_Complete_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *this_01;
  int iVar2;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Repair_Complete_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0;
  if ((local_19 & 1) != 0) {
    iVar2 = 0xc;
  }
  if ((uint)KVar1 + iVar2 < 0x1c) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Logistics_Header::Decode(&this->super_Logistics_Header,pKStack_18,(bool)(local_19 & 1));
  this_01 = KDataStream::operator>>(pKStack_18,&this->m_ui16Repair);
  KDataStream::operator>>(this_01,&this->m_ui16Padding);
  return;
}

Assistant:

void Repair_Complete_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < REPAIR_COMPLETE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Logistics_Header::Decode( stream, ignoreHeader );
    stream >> m_ui16Repair
           >> m_ui16Padding;
}